

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

bool tcu::operator<(Vec4 *k1,Vec4 *k2)

{
  float fVar1;
  float fVar2;
  Vec4 *k2_local;
  Vec4 *k1_local;
  
  fVar1 = Vector<float,_4>::y(k1);
  fVar2 = Vector<float,_4>::y(k2);
  if (fVar2 <= fVar1) {
    fVar1 = Vector<float,_4>::y(k1);
    fVar2 = Vector<float,_4>::y(k2);
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      k1_local._7_1_ = false;
    }
    else {
      fVar1 = Vector<float,_4>::x(k1);
      fVar2 = Vector<float,_4>::x(k2);
      k1_local._7_1_ = fVar1 < fVar2;
    }
  }
  else {
    k1_local._7_1_ = true;
  }
  return k1_local._7_1_;
}

Assistant:

static bool operator<(tcu::Vec4 const& k1, tcu::Vec4 const& k2)
{
	if (k1.y() < k2.y())
	{
		return true;
	}
	else if (k1.y() == k2.y())
	{
		return k1.x() < k2.x();
	}
	else
	{
		return false;
	}
}